

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O3

bool __thiscall Refal2::CDirectiveParser::StartParseIfDirective(CDirectiveParser *this)

{
  int iVar1;
  int iVar2;
  TNumber TVar3;
  TDirectiveType TVar4;
  code *pcVar5;
  
  if ((this->super_CRuleParser).super_CQualifierParser.token.type != TT_Word) {
    __assert_fail("token.type == TT_Word",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/DirectiveParser.cpp"
                  ,0x47,"bool Refal2::CDirectiveParser::StartParseIfDirective()");
  }
  TVar4 = findDirective((Refal2 *)
                        (this->super_CRuleParser).super_CQualifierParser.token.word._M_dataplus._M_p
                        ,(string *)
                         (this->super_CRuleParser).super_CQualifierParser.token.word.
                         _M_string_length);
  if (TVar4 == DT_None) goto LAB_0011ab5b;
  CRuleParser::EndFunction(&this->super_CRuleParser);
  (this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState.state =
       PES_NotFinished;
  iVar1 = (this->super_CRuleParser).super_CQualifierParser.token.line;
  iVar2 = (this->super_CRuleParser).super_CQualifierParser.token.position;
  TVar3 = (this->super_CRuleParser).super_CQualifierParser.token.number;
  (this->directive).type = (this->super_CRuleParser).super_CQualifierParser.token.type;
  (this->directive).line = iVar1;
  (this->directive).position = iVar2;
  (this->directive).number = TVar3;
  (this->directive).word._M_string_length = 0;
  *(this->directive).word._M_dataplus._M_p = '\0';
  std::__cxx11::string::swap((string *)&(this->super_CRuleParser).super_CQualifierParser.token.word)
  ;
  if (4 < TVar4 - DT_Start) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/DirectiveParser.cpp"
                  ,100,"bool Refal2::CDirectiveParser::StartParseIfDirective()");
  }
  switch(TVar4) {
  case DT_Start:
    this->state = S_Simple;
    CModuleBuilder::StartModule((CModuleBuilder *)this,&this->directive);
    goto LAB_0011ab5b;
  case DT_End:
    this->state = S_Simple;
    CModuleBuilder::EndModule((CModuleBuilder *)this,&this->directive);
    goto LAB_0011ab5b;
  case DT_Empty:
    this->state = S_OneName;
    pcVar5 = addEmpty;
    break;
  case DT_External:
    this->state = S_TwoNames;
    pcVar5 = addExternal;
    break;
  case DT_Entry:
    this->state = S_TwoNames;
    pcVar5 = addEntry;
  }
  this->handler = (THandler)pcVar5;
  *(undefined8 *)&this->field_0x1ef0 = 0;
LAB_0011ab5b:
  return TVar4 != DT_None;
}

Assistant:

bool CDirectiveParser::StartParseIfDirective()
{
	assert( token.type == TT_Word );
	TDirectiveType directiveType = findDirective( token.word );
	if( directiveType != DT_None ) {
		CRuleParser::EndFunction();
		CParsingElementState::Reset();
		token.Move( directive );
		switch( directiveType ) {
			case DT_Start:
				state = S_Simple;
				CModuleBuilder::StartModule( directive );
				break;
			case DT_End:
				state = S_Simple;
				CModuleBuilder::EndModule( directive );
				break;
			case DT_Empty:
				state = S_OneName;
				handler = &CDirectiveParser::addEmpty;
				break;
			case DT_External:
				state = S_TwoNames;
				handler = &CDirectiveParser::addExternal;
				break;
			case DT_Entry:
				state = S_TwoNames;
				handler = &CDirectiveParser::addEntry;
				break;
			case DT_None:
			default:
				assert( false );
				break;
		}
		return true;
	}
	return false;
}